

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintElem.hpp
# Opt level: O2

void __thiscall OpenMD::ConstraintElem::ConstraintElem(ConstraintElem *this,StuntDouble *sd)

{
  shared_ptr<OpenMD::SimpleTypeData<bool>_> *psVar1;
  StuntDouble *pSVar2;
  allocator<char> local_81;
  __shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2> local_80 [2];
  shared_ptr<OpenMD::GenericData> movingData;
  shared_ptr<OpenMD::GenericData> movedData;
  __shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this->sd_ = sd;
  (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"Moved",(allocator<char> *)&movingData);
  StuntDouble::getPropertyByName((StuntDouble *)&movedData,(string *)sd);
  psVar1 = &this->moved_;
  std::__cxx11::string::~string((string *)local_80);
  if (movedData.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<OpenMD::SimpleTypeData<bool>,char_const(&)[6]>((char (*) [6])local_80);
    std::__shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar1->super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
               ,local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80[0]._M_refcount);
    pSVar2 = this->sd_;
    std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<OpenMD::SimpleTypeData<bool>,void>
              (local_30,&psVar1->
                         super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
              );
    StuntDouble::addProperty(pSVar2,(shared_ptr<OpenMD::GenericData> *)local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  else {
    std::dynamic_pointer_cast<OpenMD::SimpleTypeData<bool>,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)local_80);
    std::__shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar1->super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
               ,local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80[0]._M_refcount);
    if ((psVar1->super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == (element_type *)0x0) {
      memcpy(&painCave,
             "Generic Data with keyword Moved exists, however, it can not be casted to a BoolGenericData.\n"
             ,0x5d);
      painCave.isFatal = 1;
      simError();
    }
  }
  pSVar2 = this->sd_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"Moving",&local_81);
  StuntDouble::getPropertyByName((StuntDouble *)&movingData,(string *)pSVar2);
  psVar1 = &this->moving_;
  std::__cxx11::string::~string((string *)local_80);
  if (movingData.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<OpenMD::SimpleTypeData<bool>,char_const(&)[7]>((char (*) [7])local_80);
    std::__shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar1->super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
               ,local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80[0]._M_refcount);
    pSVar2 = this->sd_;
    std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<OpenMD::SimpleTypeData<bool>,void>
              (local_40,&psVar1->
                         super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
              );
    StuntDouble::addProperty(pSVar2,(shared_ptr<OpenMD::GenericData> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  else {
    std::dynamic_pointer_cast<OpenMD::SimpleTypeData<bool>,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)local_80);
    std::__shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar1->super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
               ,local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80[0]._M_refcount);
    if ((psVar1->super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == (element_type *)0x0) {
      memcpy(&painCave,
             "Generic Data with keyword Moving exists, however, it can not be casted to a BoolGenericData.\n"
             ,0x5e);
      painCave.isFatal = 1;
      simError();
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&movingData.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&movedData.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ConstraintElem(StuntDouble* sd) : sd_(sd) {
      std::shared_ptr<GenericData> movedData = sd_->getPropertyByName("Moved");
      if (movedData != nullptr) {  // if generic data with keyword "moved"
                                   // exists, assign it to moved_
        moved_ = std::dynamic_pointer_cast<BoolGenericData>(movedData);
        if (moved_ == nullptr) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Generic Data with keyword Moved exists, however, it can not "
              "be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {  // if generic data with keyword "moved" does not exist, create
                // it
        moved_ = std::make_shared<BoolGenericData>("Moved");
        sd_->addProperty(moved_);
      }

      std::shared_ptr<GenericData> movingData =
          sd_->getPropertyByName("Moving");
      if (movingData != nullptr) {
        moving_ = std::dynamic_pointer_cast<BoolGenericData>(movingData);
        if (moving_ == nullptr) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Generic Data with keyword Moving exists, however, it can "
                   "not be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {
        moving_ = std::make_shared<BoolGenericData>("Moving");
        sd_->addProperty(moving_);
      }
    }